

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utest.h
# Opt level: O3

int utest_should_filter_test(char *filter,char *testcase)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  
  uVar2 = 0;
  if (filter != (char *)0x0) {
    cVar4 = *filter;
    pcVar5 = filter;
    while (pcVar3 = pcVar5, cVar4 != '\0') {
      if (*testcase == '\0') {
        return 1;
      }
      if (cVar4 == '*') {
        cVar4 = pcVar5[1];
        while( true ) {
          pcVar3 = pcVar3 + 1;
          if (cVar4 == '\0') goto LAB_0010b5f7;
          cVar1 = *testcase;
          if ((cVar4 == '*') || (cVar1 == '\0')) break;
          if (cVar4 != cVar1) {
            pcVar3 = pcVar5;
          }
          testcase = testcase + 1;
          cVar4 = pcVar3[1];
        }
        pcVar5 = pcVar3;
        if (cVar1 == '\0') {
          return 1;
        }
      }
      else {
        if (*testcase != cVar4) {
          return 1;
        }
        testcase = testcase + 1;
        cVar4 = pcVar5[1];
        pcVar5 = pcVar5 + 1;
      }
    }
LAB_0010b5f7:
    uVar2 = 0;
    if (*testcase != '\0') {
      if (pcVar3 == filter) {
        return 1;
      }
      uVar2 = (uint)(pcVar3[-1] != '*');
    }
  }
  return uVar2;
}

Assistant:

UTEST_WEAK int utest_should_filter_test(const char *filter,
                                        const char *testcase) {
  if (filter) {
    const char *filter_cur = filter;
    const char *testcase_cur = testcase;
    const char *filter_wildcard = 0;

    while (('\0' != *filter_cur) && ('\0' != *testcase_cur)) {
      if ('*' == *filter_cur) {
        /* store the position of the wildcard */
        filter_wildcard = filter_cur;

        /* skip the wildcard character */
        filter_cur++;

        while (('\0' != *filter_cur) && ('\0' != *testcase_cur)) {
          if ('*' == *filter_cur) {
            /*
               we found another wildcard (filter is something like *foo*) so we
               exit the current loop, and return to the parent loop to handle
               the wildcard case
            */
            break;
          } else if (*filter_cur != *testcase_cur) {
            /* otherwise our filter didn't match, so reset it */
            filter_cur = filter_wildcard;
          }

          /* move testcase along */
          testcase_cur++;

          /* move filter along */
          filter_cur++;
        }

        if (('\0' == *filter_cur) && ('\0' == *testcase_cur)) {
          return 0;
        }

        /* if the testcase has been exhausted, we don't have a match! */
        if ('\0' == *testcase_cur) {
          return 1;
        }
      } else {
        if (*testcase_cur != *filter_cur) {
          /* test case doesn't match filter */
          return 1;
        } else {
          /* move our filter and testcase forward */
          testcase_cur++;
          filter_cur++;
        }
      }
    }

    if (('\0' != *filter_cur) ||
        (('\0' != *testcase_cur) &&
         ((filter == filter_cur) || ('*' != filter_cur[-1])))) {
      /* we have a mismatch! */
      return 1;
    }
  }

  return 0;
}